

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

void inform_decode(int32_t encoding,int b,int *state,size_t n,inform_error *err)

{
  inform_error iVar1;
  bool bVar2;
  
  if (-1 < encoding) {
    if (b < 2) {
      if (err == (inform_error *)0x0) {
        return;
      }
      iVar1 = INFORM_EBASE;
      goto LAB_0013923b;
    }
    if (n != 0 && state != (int *)0x0) {
      while (bVar2 = n != 0, n = n - 1, bVar2) {
        state[n] = (uint)encoding % (uint)b;
        encoding = (uint)encoding / (uint)b;
      }
      if (err == (inform_error *)0x0 || encoding == 0) {
        return;
      }
      iVar1 = INFORM_EENCODE;
      goto LAB_0013923b;
    }
  }
  if (err == (inform_error *)0x0) {
    return;
  }
  iVar1 = INFORM_EARG;
LAB_0013923b:
  *err = iVar1;
  return;
}

Assistant:

void inform_decode(int32_t encoding, int b, int *state, size_t n, inform_error *err)
{
    if (encoding < 0)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EARG);
    else if (b < 2)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EBASE);
    else if (state == NULL || n == 0)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EARG);

    for (size_t i = 0; i < n; ++i, encoding /= b)
        state[n - i - 1] = encoding % b;

    if (encoding != 0)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EENCODE);
}